

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator fmt::v7::
         vformat_to<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                   (iterator out,basic_string_view<char> format_str,
                   basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                   args,locale_ref loc)

{
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *last;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_00;
  undefined1 value [16];
  undefined1 value_00 [16];
  bool bVar1;
  type tVar2;
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *lhs;
  char *pcVar3;
  size_t sVar4;
  float value_01;
  iterator this;
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *end;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_2
  aVar5;
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *end_00;
  basic_string_view<char> value_02;
  undefined8 in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff72;
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *local_80;
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  h;
  writer write;
  
  aVar5 = args.field_1;
  pcVar3 = (char *)args.desc_;
  sVar4 = format_str.size_;
  lhs = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
         *)format_str.data_;
  this.container = out.container;
  if ((sVar4 == 2) &&
     (this.container = (buffer<char> *)lhs, bVar1 = detail::equal2((char *)lhs,"{}"), bVar1)) {
    if ((long)pcVar3 < 0) {
      if (((int)(type)args.desc_ < 1) || (tVar2 = (aVar5.args_)->type_, tVar2 == none_type))
      goto LAB_0010fc51;
    }
    else {
      tVar2 = (type)args.desc_ & custom_type;
      if (((undefined1  [16])args & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_0010fc51:
        detail::error_handler::on_error((error_handler *)this.container,"argument not found");
      }
    }
    out_00.container = *(buffer<char> **)&(aVar5.values_)->field_0;
    value_01 = SUB84(out_00.container,0);
    h._0_8_ = out.container;
    h.parse_context.format_str_.data_ = pcVar3;
    h.parse_context.format_str_.size_ = (size_t)aVar5;
    h.parse_context._16_8_ = loc.locale_;
    switch(tVar2) {
    case int_type:
      h.context.out_ =
           detail::write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_int,_0>
                     (out.container,(int)value_01);
      break;
    case uint_type:
      h.context.out_ =
           detail::
           write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned_int,_0>
                     (out.container,(uint)value_01);
      break;
    case long_long_type:
      h.context.out_ =
           detail::
           write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_long_long,_0>
                     (out.container,out_00.container);
      break;
    case ulong_long_type:
      h.context.out_ =
           detail::
           write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned_long_long,_0>
                     (out.container,out_00.container);
      break;
    case int128_type:
      value._8_2_ = in_stack_ffffffffffffff70;
      value._0_8_ = in_stack_ffffffffffffff68;
      value._10_6_ = in_stack_ffffffffffffff72;
      h.context.out_ =
           detail::
           write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,___int128,_0>
                     (out.container,out_00,(__int128)value);
      break;
    case uint128_type:
      value_00._8_2_ = in_stack_ffffffffffffff70;
      value_00._0_8_ = in_stack_ffffffffffffff68;
      value_00._10_6_ = in_stack_ffffffffffffff72;
      h.context.out_ =
           detail::
           write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned___int128,_0>
                     (out.container,out_00,(unsigned___int128)value_00);
      break;
    case bool_type:
      h.context.out_ =
           detail::write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                     (out.container,(bool)((byte)out_00.container & 1));
      break;
    case char_type:
      h.context.out_ =
           detail::write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                     (out.container,(byte)out_00.container);
      break;
    case float_type:
      h.context.out_ =
           detail::write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_float,_0>
                     (out.container,value_01);
      break;
    case double_type:
      h.context.out_ =
           detail::write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_double,_0>
                     (out.container,out_00.container);
      break;
    case last_numeric_type:
      h.context.out_ =
           detail::
           write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_long_double,_0>
                     (out.container,((aVar5.values_)->field_0).long_double_value);
      break;
    case cstring_type:
      h.context.out_ =
           detail::write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                     (out.container,out_00.container);
      break;
    case string_type:
      value_02.size_ = (size_t)&switchD_0010fb5d::switchdataD_0012301c;
      value_02.data_ = (char *)((aVar5.values_)->field_0).string.size;
      h.context.out_ =
           detail::write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                     (out.container,out_00,value_02);
      break;
    case pointer_type:
      h.context.out_ =
           detail::write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                     (out.container,out_00.container);
      break;
    case custom_type:
      h.context.out_ =
           detail::
           default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::
           operator()((default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
                       *)&h,(handle)((aVar5.values_)->field_0).string);
      break;
    default:
      h.context.out_ =
           detail::write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                     (out.container);
    }
  }
  else {
    h.parse_context._16_8_ = (ulong)(uint)h.parse_context._20_4_ << 0x20;
    last = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
            *)(&lhs->field_0x0 + sVar4);
    end_00 = lhs;
    h.context.loc_.locale_ = loc.locale_;
    h.context.args_.field_1 = aVar5;
    h.context.args_.desc_ = (unsigned_long_long)pcVar3;
    h.context.out_.container = out.container;
    h.parse_context.format_str_.size_ = sVar4;
    h.parse_context.format_str_.data_ = (char *)lhs;
    if ((long)sVar4 < 0x20) {
      while (end = end_00, end != last) {
        end_00 = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                  *)&end->field_0x1;
        if (*(char *)end == '}') {
          if ((end_00 == last) || (*(char *)end_00 != '}')) {
            detail::error_handler::on_error
                      ((error_handler *)this.container,"unmatched \'}\' in format string");
          }
          this.container = (buffer<char> *)&h;
          detail::
          format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
          ::on_text(&h,(char *)lhs,(char *)end_00);
          lhs = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                 *)&end->field_0x2;
          end_00 = lhs;
        }
        else if (*(char *)end == '{') {
          detail::
          format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
          ::on_text(&h,(char *)lhs,(char *)end);
          lhs = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                 *)detail::
                   parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>&>
                             ((char *)end,(char *)last,&h);
          end_00 = lhs;
          this.container = (buffer<char> *)end;
        }
      }
      detail::
      format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
      ::on_text(&h,(char *)lhs,(char *)last);
    }
    else {
      write.handler_ = &h;
      while (lhs != last) {
        local_80 = lhs;
        if ((*(char *)lhs != '{') &&
           (bVar1 = detail::find<false,char,char_const*>
                              (&lhs->field_0x1,(char *)last,'{',(char **)&local_80), !bVar1)) {
          detail::
          parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_&>
          ::writer::operator()(&write,(char *)lhs,(char *)last);
          return (iterator)h.context.out_.container;
        }
        detail::
        parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_&>
        ::writer::operator()(&write,(char *)lhs,(char *)local_80);
        lhs = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
               *)detail::
                 parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>&>
                           ((char *)local_80,(char *)last,&h);
      }
    }
  }
  return (iterator)h.context.out_.container;
}

Assistant:

typename Context::iterator vformat_to(
    typename ArgFormatter::iterator out, basic_string_view<Char> format_str,
    basic_format_args<Context> args,
    detail::locale_ref loc = detail::locale_ref()) {
  if (format_str.size() == 2 && detail::equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) detail::error_handler().on_error("argument not found");
    using iterator = typename ArgFormatter::iterator;
    return visit_format_arg(
        detail::default_arg_formatter<iterator, Char>{out, args, loc}, arg);
  }
  detail::format_handler<ArgFormatter, Char, Context> h(out, format_str, args,
                                                        loc);
  detail::parse_format_string<false>(format_str, h);
  return h.context.out();
}